

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstd::
optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *v)

{
  long *plVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  pointer pcVar5;
  undefined8 uVar6;
  
  if (this->set == true) {
    plVar4 = *(long **)((long)&this->optionalValue + 8);
    plVar1 = (long *)((long)&this->optionalValue + 0x18);
    if (plVar4 != plVar1) {
      operator_delete(plVar4,*plVar1 + 1);
    }
    this->set = false;
  }
  *(int *)&this->optionalValue = v->first;
  psVar2 = (size_type *)((long)&this->optionalValue + 0x18);
  *(size_type **)((long)&this->optionalValue + 8) = psVar2;
  pcVar5 = (v->second)._M_dataplus._M_p;
  paVar3 = &(v->second).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar3) {
    uVar6 = *(undefined8 *)((long)&(v->second).field_2 + 8);
    *psVar2 = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&this->optionalValue + 0x20) = uVar6;
  }
  else {
    *(pointer *)((long)&this->optionalValue + 8) = pcVar5;
    *(size_type *)((long)&this->optionalValue + 0x18) = paVar3->_M_allocated_capacity;
  }
  *(size_type *)((long)&this->optionalValue + 0x10) = (v->second)._M_string_length;
  (v->second)._M_dataplus._M_p = (pointer)paVar3;
  (v->second)._M_string_length = 0;
  (v->second).field_2._M_local_buf[0] = '\0';
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(T &&v) {
        reset();
        new (ptr()) T(std::move(v));
        set = true;
        return *this;
    }